

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_base.h
# Opt level: O2

void __thiscall bandit::reporter::progress_base::it_unknown_error(progress_base *this,string *desc)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  this->specs_failed_ = this->specs_failed_ + 1;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::endl<char,std::char_traits<char>>(local_190);
  current_context_name_abi_cxx11_(&local_1c0,this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)desc);
  poVar1 = std::operator<<(poVar1,":");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::operator<<(local_190,"Unknown exception");
  std::endl<char,std::char_traits<char>>(local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->failures_,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        specs_failed_++;

        std::stringstream ss;
        ss << std::endl;
        ss << current_context_name() << " " << desc << ":" << std::endl;
        ss << "Unknown exception";
        ss << std::endl;

        failures_.push_back(ss.str());
      }